

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshfile_operations.cpp
# Opt level: O2

int generate_shapes(map<int,_face_properties,_std::less<int>,_std::allocator<std::pair<const_int,_face_properties>_>_>
                    *faces_map,
                   map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *materials_map,string *geo_file_path)

{
  int iVar1;
  int iVar2;
  _Rb_tree_header *p_Var3;
  iterator iVar4;
  _Base_ptr p_Var5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  iterator placeholder;
  _Rb_tree_header *p_Var8;
  bool bVar9;
  int iVar10;
  byte bVar11;
  _Self __tmp_2;
  uint uVar12;
  _Self __tmp_1;
  iterator __position;
  pointer piVar13;
  bool bVar14;
  _Self __tmp;
  int *piVar15;
  bool bVar16;
  int local_464;
  _Rb_tree_node_base *local_460;
  int local_458;
  int local_454;
  int local_450;
  vector<int,_std::allocator<int>_> current_shape_vector;
  map<int,_line,_std::less<int>,_std::allocator<std::pair<const_int,_line>_>_> current_faces_map;
  string curve_loop;
  ostringstream curve;
  int iStack_3a4;
  ofstream geo_file;
  
  std::ofstream::ofstream((string *)&geo_file);
  std::ofstream::open((string *)&geo_file,(_Ios_Openmode)geo_file_path);
  std::operator<<((ostream *)&geo_file,
                  "//======================== Material Shapes =========================\n");
  p_Var3 = &(faces_map->_M_t)._M_impl.super__Rb_tree_header;
  iVar4._M_node = (faces_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while (__position._M_node = iVar4._M_node, (_Rb_tree_header *)__position._M_node != p_Var3) {
    iVar1 = *(int *)((long)&__position._M_node[1]._M_parent + 4);
    iVar4._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    if (iVar1 == 3) {
      std::
      _Rb_tree<int,std::pair<int_const,face_properties>,std::_Select1st<std::pair<int_const,face_properties>>,std::less<int>,std::allocator<std::pair<int_const,face_properties>>>
      ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,face_properties>,std::_Select1st<std::pair<int_const,face_properties>>,std::less<int>,std::allocator<std::pair<int_const,face_properties>>>
                          *)faces_map,__position);
    }
  }
  p_Var7 = (materials_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar9 = false;
  local_464 = 0;
  do {
    p_Var8 = &current_faces_map._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var7 == &(materials_map->_M_t)._M_impl.super__Rb_tree_header) {
      std::ofstream::~ofstream(&geo_file);
      return (uint)bVar9;
    }
    current_faces_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    current_faces_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    current_faces_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var5 = (faces_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    current_faces_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var8->_M_header;
    current_faces_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var8->_M_header;
    for (; (_Rb_tree_header *)p_Var5 != p_Var3; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5))
    {
      if ((*(_Rb_tree_color *)&p_Var5[1]._M_left == p_Var7[1]._M_color) ||
         (*(_Rb_tree_color *)((long)&p_Var5[1]._M_left + 4) == p_Var7[1]._M_color)) {
        _curve = p_Var5[1]._M_color;
        iStack_3a4 = *(int *)&p_Var5[1].field_0x4;
        std::
        _Rb_tree<int,std::pair<int_const,line>,std::_Select1st<std::pair<int_const,line>>,std::less<int>,std::allocator<std::pair<int_const,line>>>
        ::_M_emplace_unique<std::pair<int,line>>
                  ((_Rb_tree<int,std::pair<int_const,line>,std::_Select1st<std::pair<int_const,line>>,std::less<int>,std::allocator<std::pair<int_const,line>>>
                    *)&current_faces_map,(pair<int,_line> *)&curve);
      }
    }
    iVar1 = (int)current_faces_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_460 = current_faces_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_458 = 0;
    local_450 = 0;
    local_454 = 0;
    bVar14 = false;
LAB_00131051:
    if ((local_454 != iVar1) && (!bVar9)) {
      current_shape_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      current_shape_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      current_shape_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      do {
        bVar16 = bVar9;
        do {
          while( true ) {
            bVar9 = bVar16;
            if (bVar14) {
              bVar11 = 0;
              uVar12 = 0;
              goto LAB_001310e5;
            }
            if (*(char *)((long)&local_460[1]._M_parent + 4) == '\x01') break;
            local_458 = *(int *)&local_460[1].field_0x4;
            local_450 = *(int *)&local_460[1]._M_parent;
            std::vector<int,_std::allocator<int>_>::push_back
                      (&current_shape_vector,(value_type_conflict1 *)(local_460 + 1));
            *(undefined1 *)((long)&local_460[1]._M_parent + 4) = 1;
            local_454 = local_454 + 1;
            bVar14 = true;
            bVar16 = bVar9;
          }
          bVar16 = true;
        } while ((_Rb_tree_header *)local_460 ==
                 &current_faces_map._M_t._M_impl.super__Rb_tree_header);
        local_460 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_460);
      } while( true );
    }
    p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    std::
    _Rb_tree<int,_std::pair<const_int,_line>,_std::_Select1st<std::pair<const_int,_line>_>,_std::less<int>,_std::allocator<std::pair<const_int,_line>_>_>
    ::~_Rb_tree(&current_faces_map._M_t);
  } while( true );
LAB_001310e5:
  if (!(bool)(bVar11 | bVar9)) {
    if (*(char *)((long)&local_460[1]._M_parent + 4) == '\0') {
      iVar2 = *(int *)&local_460[1].field_0x4;
      iVar10 = *(int *)&local_460[1]._M_parent;
      if (local_450 == iVar2) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (&current_shape_vector,(value_type_conflict1 *)(local_460 + 1));
        bVar16 = iVar10 == local_458;
        if (bVar16) {
          bVar11 = 1;
        }
      }
      else {
        if (local_450 != iVar10) goto LAB_0013119b;
        _curve = -local_460[1]._M_color;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  (&current_shape_vector,(int *)&curve);
        bVar16 = iVar2 == local_458;
        iVar10 = iVar2;
        if (bVar16) {
          bVar11 = 1;
        }
      }
      local_464 = local_464 + (uint)bVar16;
      *(undefined1 *)((long)&local_460[1]._M_parent + 4) = 1;
      local_454 = local_454 + 1;
      local_460 = current_faces_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_450 = iVar10;
    }
LAB_0013119b:
    if ((_Rb_tree_header *)local_460 == &current_faces_map._M_t._M_impl.super__Rb_tree_header) {
      if (bVar11 == 0) {
        bVar9 = true;
      }
    }
    else {
      local_460 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_460);
    }
    bVar16 = 0xf423e < uVar12;
    uVar12 = uVar12 + 1;
    if (bVar16) {
      bVar9 = true;
    }
    goto LAB_001310e5;
  }
  if (bVar11 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&curve);
    poVar6 = std::operator<<((ostream *)&curve,"Curve Loop(");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_464);
    std::operator<<(poVar6,") = {");
    piVar15 = current_shape_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish + -1;
    for (piVar13 = current_shape_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start; piVar13 != piVar15; piVar13 = piVar13 + 1) {
      poVar6 = (ostream *)std::ostream::operator<<(&curve,*piVar13);
      std::operator<<(poVar6,", ");
    }
    poVar6 = (ostream *)std::ostream::operator<<((ostringstream *)&curve,*piVar13);
    std::operator<<(poVar6,"};\n");
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)&geo_file,(string *)&curve_loop);
    poVar6 = std::operator<<((ostream *)&geo_file,"Plane Surface(");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_464);
    poVar6 = std::operator<<(poVar6,") = {");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_464);
    std::operator<<(poVar6,"};\n");
    poVar6 = std::operator<<((ostream *)&geo_file,"Physical Surface(\"");
    poVar6 = std::operator<<(poVar6,(string *)&p_Var7[1]._M_parent);
    poVar6 = std::operator<<(poVar6," ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_464);
    poVar6 = std::operator<<(poVar6,"\") = {");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_464);
    std::operator<<(poVar6,"};\n");
    std::__cxx11::string::~string((string *)&curve_loop);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&curve);
    bVar14 = false;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&current_shape_vector.super__Vector_base<int,_std::allocator<int>_>);
  goto LAB_00131051;
}

Assistant:

int generate_shapes(std::map<int, face_properties> &faces_map,
                    std::map<int, std::string> &materials_map,
                    const std::string &geo_file_path)
{
    std::ofstream geo_file;
    geo_file.open(geo_file_path, std::ios::out | std::ios::app);
    geo_file << "//======================== Material Shapes =========================\n";
    bool unable_to_complete_shape = false;
    //First remove the insider faces as we do not require them------------------------
    std::map<int, face_properties>::iterator faces_iterator = faces_map.begin();
    while (faces_iterator != faces_map.end())
    {
        if (faces_iterator->second.face_type == 3)
        {
            std::map<int, face_properties>::iterator placeholder = faces_iterator;
            faces_iterator++;
            faces_map.erase(placeholder);
        }
        else
        {
            faces_iterator++;
        }
    }
    //============================== Shape Finder Code ==============================
    std::map<int, std::string>::iterator material_being_shaped = materials_map.begin();
    int total_shapes_count = 0;
    bool error_reached = false;
    while (material_being_shaped != materials_map.end())
    {
        std::map<int, line> current_faces_map;
        faces_iterator = faces_map.begin();
        // Create a map of all the faces that are borders for this material type
        while (faces_iterator != faces_map.end())
        {
            // if face is child of parent material and is a boundary, add it to the allowable map for border placement.
            if ((faces_iterator->second.parent_materials[0] == material_being_shaped->first) || (faces_iterator->second.parent_materials[1] == material_being_shaped->first))
            {
                line temp;
                temp.a = faces_iterator->second.first_node;
                temp.b = faces_iterator->second.second_node;
                temp.used = false;
                current_faces_map.insert(std::pair<int, line>(faces_iterator->first, temp));
            }
            faces_iterator++;
        }
        // This section looks for loops
        bool new_start_found = false;
        int all_used_requirement = current_faces_map.size();
        int faces_used_counter = 0;
        int origin = 0;
        int current_head = 0;
        std::map<int, line>::iterator current_faces_iterator = current_faces_map.begin();
        // Internal loop to complete all material shapes
        while ((check_for_completion(all_used_requirement, faces_used_counter) == false) && (unable_to_complete_shape == false))
        {
            std::vector<int> current_shape_vector;
            while (new_start_found == false)
            {
                if (current_faces_iterator->second.used == true)
                {
                    if (current_faces_iterator != current_faces_map.end())
                    {
                        current_faces_iterator++;
                    }
                    else
                    {
                        unable_to_complete_shape = true; //Means all shapes were not completed without causing an error
                    }
                }
                else
                {
                    new_start_found = true;
                    origin = current_faces_iterator->second.a;
                    current_head = current_faces_iterator->second.b;
                    current_shape_vector.push_back(current_faces_iterator->first);
                    current_faces_iterator->second.used = true;
                    faces_used_counter++;
                }
            }
            bool current_shape_complete = false;
            bool timed_out = false;
            int submaterial_loop_counter = 0;
            while ((current_shape_complete == false) && (unable_to_complete_shape == false))
            {
                if (current_faces_iterator->second.used == false)
                {
                    if (current_head == current_faces_iterator->second.a)
                    {
                        current_head = current_faces_iterator->second.b;
                        if (current_head == origin) //reached starting point
                        {
                            current_shape_complete = true;
                            total_shapes_count++;
                        }
                        current_shape_vector.push_back(current_faces_iterator->first);
                        current_faces_iterator->second.used = true;
                        faces_used_counter++;
                        current_faces_iterator = current_faces_map.begin(); //Send back to start to check for previously skipped entries that might be relevant now
                    }
                    else if (current_head == current_faces_iterator->second.b)
                    {
                        current_head = current_faces_iterator->second.a;
                        if (current_head == origin) //reached starting point
                        {
                            current_shape_complete = true;
                            total_shapes_count++;
                        }
                        current_shape_vector.push_back(-(current_faces_iterator->first));
                        current_faces_iterator->second.used = true;
                        faces_used_counter++;
                        current_faces_iterator = current_faces_map.begin();
                    }
                }
                if (current_faces_iterator != current_faces_map.end())
                {
                    current_faces_iterator++;
                }
                else
                {
                    if (current_shape_complete == false)
                    {
                        unable_to_complete_shape = true; //never found origin before faces map ended
                    }
                }
                submaterial_loop_counter++;
                if (submaterial_loop_counter >= LOOPTIMEOUT)
                {
                    unable_to_complete_shape = true; //timeout
                }
            }
            if (current_shape_complete == true)
            {
                // plot the vector with a unique curve loop ID & make it a child of physical group
                std::ostringstream curve;
                curve << "Curve Loop(" << total_shapes_count << ") = {";
                auto vector_iterator = current_shape_vector.begin();
                auto final = current_shape_vector.end();
                final--;
                while (vector_iterator != final)
                {
                    curve << *vector_iterator << ", ";
                    vector_iterator++;
                }
                curve << *vector_iterator << "};\n";
                std::string curve_loop = curve.str();
                geo_file << curve_loop;
                geo_file << "Plane Surface(" << total_shapes_count << ") = {" << total_shapes_count << "};\n";
                geo_file << "Physical Surface(\"" << material_being_shaped->second << " " << total_shapes_count << "\") = {" << total_shapes_count << "};\n";
                new_start_found = false;
            }
        }
        if (unable_to_complete_shape == true)
        {
            error_reached = true;
        }
        else
        {
            error_reached = false;
        }
        material_being_shaped++;
    }
    if (error_reached == false)
    {
        return EXIT_SUCCESS;
    }
    else
    {
        return EXIT_FAILURE;
    }
}